

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::decodeArray
          (SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t param_2,
          uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  pointer puVar2;
  long lVar3;
  uint uVar4;
  NotEnoughStorage *this_00;
  uint32_t *puVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint bit;
  pointer local_58;
  uint *local_50;
  uint32_t *local_48;
  ulong *local_40;
  ulong local_38;
  
  uVar1 = *in;
  uVar8 = *nvalue;
  if (uVar8 < uVar1 << 7) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,(ulong)*in);
    __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar6 = in + 1;
  puVar5 = out;
  if (uVar1 != 0) {
    uVar8 = 0;
    local_48 = out;
    local_40 = nvalue;
    do {
      uVar4 = *puVar6;
      puVar6 = puVar6 + 1;
      uVar7 = uVar4 >> 0x10 & 0x3ff;
      local_38 = uVar8;
      if (((uVar4 & 0xffff) != 0) &&
         (local_58 = (this->exceptions).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start, local_50 = puVar6, uVar7 != 0)) {
        puVar2 = local_58 + (ulong)uVar7 * 2;
        do {
          (**(code **)(Simple16<false>::unpackarray + (ulong)(*local_50 >> 0x1c) * 8))
                    (&local_58,&local_50);
        } while (local_58 < puVar2);
      }
      bit = uVar4 >> 0x1a;
      usimdunpack((__m128i *)(puVar6 + ((ulong)uVar4 & 0xffff)),out,bit);
      if (uVar7 != 0) {
        uVar8 = 0xffffffff;
        uVar9 = 0;
        puVar2 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar8 = (ulong)(uint)((int)uVar8 + 1 + *(int *)((long)puVar2 + uVar9));
          lVar3 = uVar9 + uVar7 * 4;
          uVar9 = uVar9 + 4;
          out[uVar8] = out[uVar8] | *(int *)((long)puVar2 + lVar3) + 1 << (bit & 0x1f);
        } while (uVar7 * 4 != uVar9);
      }
      out = out + 0x80;
      puVar6 = (uint *)((long)*(__m128i *)(puVar6 + ((ulong)uVar4 & 0xffff)) + (ulong)(bit << 4));
      uVar4 = (int)local_38 + 1;
      uVar8 = (ulong)uVar4;
    } while (uVar4 != uVar1);
    uVar8 = *local_40;
    puVar5 = local_48;
    nvalue = local_40;
  }
  uVar9 = (long)out - (long)puVar5 >> 2;
  if (uVar8 < uVar9) {
    SIMDNewPFor<4u,FastPForLib::Simple16<false>>::decodeArray();
  }
  *nvalue = uVar9;
  return puVar6;
}

Assistant:

const uint32_t *
SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeArray(
#ifndef NDEBUG
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
#else
    const uint32_t *in, const size_t, uint32_t *out, size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);

  if (BlockSize * (*in) > nvalue)
    throw NotEnoughStorage(*in);
  const uint32_t numBlocks = *in++;

  for (uint32_t i = 0; i < numBlocks; i++) {

    const uint32_t b = *in >> (32 - PFORDELTA_B);

    const size_t nExceptions =
        (*in >> (32 - (PFORDELTA_B + PFORDELTA_NEXCEPT))) &
        ((1 << PFORDELTA_NEXCEPT) - 1);

    const uint32_t encodedExceptionsSize =
        *in & ((1 << PFORDELTA_EXCEPTSZ) - 1);

    size_t twonexceptions = 2 * nExceptions;
    ++in;
    if (encodedExceptionsSize > 0)
      ecoder.decodeArray(in, encodedExceptionsSize, &exceptions[0],
                         twonexceptions);
    assert(twonexceptions >= 2 * nExceptions);
    in += encodedExceptionsSize;

    uint32_t *beginout(out); // we use this later
    usimdunpack(reinterpret_cast<const __m128i *>(in), out, b);
    in += 4 * b;
    out += 128;

    for (uint32_t e = 0, lpos = 0u-1; e < nExceptions; e++) {
      lpos += exceptions[e] + 1;
      beginout[lpos] |= (exceptions[e + nExceptions] + 1) << b;
    }
  }
  if (static_cast<size_t>(out - initout) > nvalue) {
    fprintf(stderr, "possible buffer overrun\n");
  }
  ASSERT(in <= len + initin,
      std::to_string(in - initin) + " " + std::to_string(len));

  nvalue = out - initout;
  assert(nvalue == numBlocks * BlockSize);
  return in;
}